

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::MaybeAddExtraSites
          (S2Builder *this,InputEdgeId edge_id,InputEdgeId max_edge_id,
          vector<int,_std::allocator<int>_> *chain,MutableS2ShapeIndex *input_edge_index,
          vector<int,_std::allocator<int>_> *snap_queue)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer pVVar6;
  pointer ppVar7;
  bool bVar8;
  int iVar9;
  S2Point *y;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar10;
  S2Point *pSVar11;
  S2Point *a0;
  ulong uVar12;
  S2Point *x;
  BasicVector<Vector3,_double,_3UL> *this_00;
  uint uVar13;
  S1ChordAngle local_a0;
  S2Point new_site;
  S2Point mid;
  S2Point local_68;
  S2Point local_48;
  
  pcVar4 = (this->edge_sites_).
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar10 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar10 = &pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar1 = *(uint *)&pcVar4[edge_id].super_compact_array_base<int,_std::allocator<int>_>;
  uVar12 = 0;
  uVar13 = 0;
  do {
    if ((uVar1 & 0xffffff) << 2 == uVar12) {
      return;
    }
    iVar2 = *(int *)((long)paVar10 + uVar12);
    piVar5 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar3 = piVar5[(int)uVar13];
    if (iVar2 == iVar3) {
      uVar13 = uVar13 + 1;
      if ((long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2 == (long)(int)uVar13) {
        return;
      }
      pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      x = pVVar6 + iVar2;
      y = pVVar6 + piVar5[(int)uVar13];
      S1ChordAngle::S1ChordAngle(&local_a0,x,y);
      if ((this->min_edge_length_to_split_ca_).length2_ <= local_a0.length2_) {
        ppVar7 = (this->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->input_vertices_).
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        a0 = pVVar6 + ppVar7[edge_id].first;
        pSVar11 = pVVar6 + ppVar7[edge_id].second;
        bVar8 = S2::IsEdgeBNearEdgeA(a0,pSVar11,x,y,(S1Angle)(this->max_edge_deviation_).radians_);
        if (!bVar8) {
          S2::Project(&local_68,x,a0,pSVar11);
          S2::Project(&local_48,y,a0,pSVar11);
          new_site.c_[2] = local_68.c_[2] + local_48.c_[2];
          new_site.c_[0] = local_68.c_[0] + local_48.c_[0];
          new_site.c_[1] = local_68.c_[1] + local_48.c_[1];
          util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                    (&mid,(BasicVector<Vector3,_double,_3UL> *)&new_site);
          pSVar11 = &new_site;
          GetSeparationSite(pSVar11,this,&mid,x,y,edge_id);
LAB_001f2864:
          AddExtraSite(this,pSVar11,max_edge_id,input_edge_index,snap_queue);
          return;
        }
      }
    }
    else if ((0 < (int)uVar13) && (this->num_forced_sites_ <= iVar2)) {
      pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (BasicVector<Vector3,_double,_3UL> *)(pVVar6 + iVar2);
      iVar2 = piVar5[(ulong)uVar13 - 1];
      iVar9 = s2pred::CompareEdgeDistance
                        ((S2Point *)this_00,pVVar6 + iVar2,pVVar6 + iVar3,
                         (S1ChordAngle)(this->min_edge_site_separation_ca_).length2_);
      if (iVar9 < 0) {
        GetSeparationSite(&mid,this,(S2Point *)this_00,pVVar6 + iVar2,pVVar6 + iVar3,edge_id);
        bVar8 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                          (this_00,&mid);
        if (!bVar8) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&new_site,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                     ,0x351,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)new_site.c_[1],"Check failed: (site_to_avoid) != (new_site) ");
          abort();
        }
        pSVar11 = &mid;
        goto LAB_001f2864;
      }
    }
    uVar12 = uVar12 + 4;
  } while( true );
}

Assistant:

void S2Builder::MaybeAddExtraSites(InputEdgeId edge_id,
                                   InputEdgeId max_edge_id,
                                   const vector<SiteId>& chain,
                                   const MutableS2ShapeIndex& input_edge_index,
                                   vector<InputEdgeId>* snap_queue) {
  // The snapped chain is always a *subsequence* of the nearby sites
  // (edge_sites_), so we walk through the two arrays in parallel looking for
  // sites that weren't snapped.  We also keep track of the current snapped
  // edge, since it is the only edge that can be too close.
  int i = 0;
  for (SiteId id : edge_sites_[edge_id]) {
    if (id == chain[i]) {
      if (++i == chain.size()) break;
      // Check whether this snapped edge deviates too far from its original
      // position.  If so, we split the edge by adding an extra site.
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (S1ChordAngle(v0, v1) < min_edge_length_to_split_ca_) continue;

      const InputEdge& edge = input_edges_[edge_id];
      const S2Point& a0 = input_vertices_[edge.first];
      const S2Point& a1 = input_vertices_[edge.second];
      if (!S2::IsEdgeBNearEdgeA(a0, a1, v0, v1, max_edge_deviation_)) {
        // Add a new site on the input edge, positioned so that it splits the
        // snapped edge into two approximately equal pieces.  Then we find all
        // the edges near the new site (including this one) and add them to
        // the snap queue.
        //
        // Note that with large snap radii, it is possible that the snapped
        // edge wraps around the sphere the "wrong way".  To handle this we
        // find the preferred split location by projecting both endpoints onto
        // the input edge and taking their midpoint.
        S2Point mid = (S2::Project(v0, a0, a1) +
                       S2::Project(v1, a0, a1)).Normalize();
        S2Point new_site = GetSeparationSite(mid, v0, v1, edge_id);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    } else if (i > 0 && id >= num_forced_sites_) {
      // Check whether this "site to avoid" is closer to the snapped edge than
      // min_edge_vertex_separation().  Note that this is the only edge of the
      // chain that can be too close because its vertices must span the point
      // where "site_to_avoid" projects onto the input edge XY (this claim
      // relies on the fact that all sites are separated by at least the snap
      // radius).  We don't try to avoid sites added using ForceVertex()
      // because we don't guarantee any minimum separation from such sites.
      const S2Point& site_to_avoid = sites_[id];
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (s2pred::CompareEdgeDistance(
              site_to_avoid, v0, v1, min_edge_site_separation_ca_) < 0) {
        // A snapped edge can only approach a site too closely when there are
        // no sites near the input edge near that point.  We fix that by
        // adding a new site along the input edge (a "separation site"), then
        // we find all the edges near the new site (including this one) and
        // add them to the snap queue.
        S2Point new_site = GetSeparationSite(site_to_avoid, v0, v1, edge_id);
        S2_DCHECK_NE(site_to_avoid, new_site);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    }
  }
}